

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collision.h
# Opt level: O1

void __thiscall apollonia::Arbiter::AddContact(Arbiter *this,Contact *contact)

{
  pointer *ppCVar1;
  long lVar2;
  iterator __position;
  
  __position._M_current =
       (this->contacts_).super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->contacts_).super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<apollonia::Contact,std::allocator<apollonia::Contact>>::
    _M_realloc_insert<apollonia::Contact_const&>
              ((vector<apollonia::Contact,std::allocator<apollonia::Contact>> *)&this->contacts_,
               __position,contact);
  }
  else {
    for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
      (__position._M_current)->position = contact->position;
      contact = (Contact *)&contact->ra;
      __position._M_current = (Contact *)&(__position._M_current)->ra;
    }
    ppCVar1 = &(this->contacts_).
               super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppCVar1 = *ppCVar1 + 1;
  }
  if ((ulong)(((long)(this->contacts_).
                     super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(this->contacts_).
                     super__Vector_base<apollonia::Contact,_std::allocator<apollonia::Contact>_>.
                     _M_impl.super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7) < 3) {
    return;
  }
  __assert_fail("contacts_.size() <= kMaxContacts",
                "/workspace/llm4binary/github/license_c_cmakelists/wgtdkp[P]apollonia/src/collision.h"
                ,0x35,"void apollonia::Arbiter::AddContact(const Contact &)");
}

Assistant:

void AddContact(const Contact& contact) {
    contacts_.push_back(contact);
    assert(contacts_.size() <= kMaxContacts);
  }